

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O1

void __thiscall cfd::core::Serializer::AddDirectBytes(Serializer *this,ByteData256 *buffer)

{
  void *__src;
  uint32_t need_size;
  ulong uVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  void *local_30;
  long local_28;
  
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_30,&buffer->data_);
  __src = local_30;
  if (local_30 != (void *)0x0) {
    uVar1 = local_28 - (long)local_30;
    need_size = (uint32_t)uVar1;
    if (need_size != 0) {
      CheckNeedSize(this,need_size);
      memcpy((this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start + this->offset_,__src,uVar1 & 0xffffffff);
      this->offset_ = this->offset_ + need_size;
    }
  }
  if (local_30 != (void *)0x0) {
    operator_delete(local_30);
  }
  return;
}

Assistant:

void Serializer::AddDirectBytes(const ByteData256& buffer) {
  auto buf = buffer.GetBytes();
  AddDirectBytes(buf.data(), static_cast<uint32_t>(buf.size()));
}